

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int generate_by_miniscript_pk_h
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  miniscript_node_t *node_00;
  int iVar1;
  size_t child_write_len;
  uchar pubkey [65];
  size_t local_60;
  uchar local_58 [72];
  
  local_60 = *write_len;
  node_00 = node->child;
  iVar1 = -2;
  if ((0x17 < script_len && node_00 != (miniscript_node_t *)0x0) &&
     (((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)) &&
      (node_00->is_xonly_key == false)))) {
    iVar1 = generate_script_from_miniscript(node_00,node,derive_child_num,local_58,0x41,&local_60);
    if (iVar1 == 0) {
      iVar1 = wally_hash160(local_58,local_60,script + 3,0x14);
      if (iVar1 == 0) {
        script[0] = 'v';
        script[1] = 0xa9;
        script[2] = '\x14';
        script[0x17] = 0x88;
        *write_len = 0x18;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int generate_by_miniscript_pk_h(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = *write_len;
    unsigned char pubkey[EC_PUBLIC_KEY_UNCOMPRESSED_LEN];

    if (!node->child || (script_len < WALLY_SCRIPTPUBKEY_P2PKH_LEN - 1) || (parent && !parent->info))
        return WALLY_EINVAL;
    if (node->child->is_xonly_key)
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(node->child, node, derive_child_num, pubkey, sizeof(pubkey), &child_write_len);
    if (ret != WALLY_OK)
        return ret;

    ret = wally_hash160(pubkey, child_write_len, &script[3], HASH160_LEN);
    if (ret != WALLY_OK)
        return ret;

    script[0] = OP_DUP;
    script[1] = OP_HASH160;
    script[2] = HASH160_LEN;
    script[HASH160_LEN + 3] = OP_EQUALVERIFY;
    *write_len = HASH160_LEN + 4;
    return ret;
}